

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O3

int ffcalchist(long totalrows,long offset,long firstrow,long nrows,int ncols,iteratorCol *colpars,
              void *userPointer)

{
  int *piVar1;
  short *psVar2;
  double dVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  long lVar8;
  char cVar9;
  short sVar10;
  long lVar11;
  long lVar12;
  iteratorCol *piVar13;
  char *pcVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  char *pcVar18;
  bool bVar19;
  float fVar20;
  double dVar21;
  double *colptr [5];
  long local_58 [5];
  
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[4] = 0;
  if (firstrow == 1) {
    pcVar14 = *(char **)((long)userPointer + 0xe8);
    *(char **)((long)userPointer + 0xf0) = pcVar14;
  }
  else {
    pcVar14 = *(char **)((long)userPointer + 0xf0);
  }
  lVar15 = 0x18;
  lVar17 = 0;
  lVar12 = 0;
  do {
    uVar4 = *(uint *)((long)userPointer + lVar12 * 4 + 0x100);
    local_58[lVar12] = 0;
    if (-1 < (int)uVar4 && (lVar12 == 4 || lVar12 < *(int *)((long)userPointer + 0x10))) {
      iVar5 = *(int *)(*(long *)((long)userPointer + 0x120) + lVar15 * 4);
      if ((long)iVar5 < 1) {
        piVar13 = (iteratorCol *)((ulong)uVar4 * 0x110 + *(long *)((long)userPointer + 0x118));
      }
      else {
        piVar13 = (iteratorCol *)((ulong)uVar4 * 0x110 + *(long *)((long)userPointer + 0x118));
        iVar6 = fits_parser_workfn(totalrows,offset,firstrow,nrows,iVar5,piVar13,
                                   (void *)(*(long *)((long)userPointer + 0x128) + lVar17));
        if (iVar6 != 0) {
          return iVar6;
        }
        piVar13 = piVar13 + (long)iVar5 + -1;
      }
      if (piVar13 != (iteratorCol *)0x0) {
        pvVar7 = fits_iter_get_array(piVar13);
        local_58[lVar12] = (long)pvVar7;
      }
    }
    lVar12 = lVar12 + 1;
    lVar17 = lVar17 + 0x90;
    lVar15 = lVar15 + 0x3a;
  } while (lVar12 != 5);
  if (0 < nrows) {
    lVar15 = 1;
    lVar12 = 1;
    pcVar18 = pcVar14;
    do {
      if (pcVar18 == (char *)0x0) {
        pcVar14 = (char *)0x0;
LAB_001c463b:
        if (0 < *(long *)((long)userPointer + 0xf8)) {
          lVar17 = local_58[4] + lVar15 * 8;
          lVar16 = 0;
          do {
            dVar21 = *(double *)(local_58[0] + lVar15 * 8 + lVar16 * 8);
            if (((dVar21 != -9.1191291391491e-36) || (NAN(dVar21))) &&
               ((local_58[4] == 0 ||
                ((dVar3 = *(double *)(lVar17 + lVar16 * 8), dVar3 != -9.1191291391491e-36 ||
                 (NAN(dVar3))))))) {
              dVar21 = (dVar21 - *(double *)((long)userPointer + 0x48)) /
                       *(double *)((long)userPointer + 0x88);
              lVar8 = (long)(dVar21 + 1.0);
              if ((0 < lVar8) &&
                 ((lVar8 <= *(long *)((long)userPointer + 0x28) &&
                  (dVar21 < *(double *)((long)userPointer + 0x68) ||
                   dVar21 == *(double *)((long)userPointer + 0x68))))) {
                uVar4 = *(uint *)((long)userPointer + 0x10);
                if (1 < (int)uVar4) {
                  dVar21 = *(double *)(local_58[1] + lVar15 * 8 + lVar16 * 8);
                  if ((((dVar21 == -9.1191291391491e-36) && (!NAN(dVar21))) ||
                      (dVar21 = (dVar21 - *(double *)((long)userPointer + 0x50)) /
                                *(double *)((long)userPointer + 0x90), dVar21 < 0.0)) ||
                     ((*(long *)((long)userPointer + 0x30) <= (long)dVar21 ||
                      (*(double *)((long)userPointer + 0x70) <= dVar21 &&
                       dVar21 != *(double *)((long)userPointer + 0x70))))) goto LAB_001c4678;
                  lVar8 = lVar8 + (long)dVar21 * *(long *)((long)userPointer + 0xb0);
                  if (uVar4 != 2) {
                    dVar21 = *(double *)(local_58[2] + lVar15 * 8 + lVar16 * 8);
                    if (((dVar21 == -9.1191291391491e-36) && (!NAN(dVar21))) ||
                       ((dVar21 = (dVar21 - *(double *)((long)userPointer + 0x58)) /
                                  *(double *)((long)userPointer + 0x98), dVar21 < 0.0 ||
                        ((*(long *)((long)userPointer + 0x38) <= (long)dVar21 ||
                         (*(double *)((long)userPointer + 0x78) <= dVar21 &&
                          dVar21 != *(double *)((long)userPointer + 0x78))))))) goto LAB_001c4678;
                    lVar8 = lVar8 + (long)dVar21 * *(long *)((long)userPointer + 0xb8);
                    if (3 < uVar4) {
                      dVar21 = *(double *)(local_58[3] + lVar15 * 8 + lVar16 * 8);
                      if ((((dVar21 == -9.1191291391491e-36) && (!NAN(dVar21))) ||
                          (dVar21 = (dVar21 - *(double *)((long)userPointer + 0x60)) /
                                    *(double *)((long)userPointer + 0xa0), dVar21 < 0.0)) ||
                         ((*(long *)((long)userPointer + 0x40) <= (long)dVar21 ||
                          (*(double *)((long)userPointer + 0x80) <= dVar21 &&
                           dVar21 != *(double *)((long)userPointer + 0x80))))) goto LAB_001c4678;
                      lVar8 = lVar8 + (long)dVar21 * *(long *)((long)userPointer + 0xc0);
                    }
                  }
                }
                dVar21 = *(double *)((long)userPointer + 0xe0);
                if ((dVar21 != -9.1191291391491e-36) || (NAN(dVar21))) {
                  iVar5 = *(int *)((long)userPointer + 0x24);
                  if (iVar5 < 0x1f) {
                    if (iVar5 == 0xb) {
LAB_001c48c9:
                      cVar9 = (char)(int)dVar21;
LAB_001c48cd:
                      *(char *)(*userPointer + lVar8) = *(char *)(*userPointer + lVar8) + cVar9;
                    }
                    else if (iVar5 == 0x15) {
LAB_001c485c:
                      sVar10 = (short)(int)dVar21;
LAB_001c4860:
                      psVar2 = (short *)(*userPointer + lVar8 * 2);
                      *psVar2 = *psVar2 + sVar10;
                    }
                  }
                  else {
                    if (iVar5 == 0x52) goto LAB_001c48eb;
                    if (iVar5 == 0x2a) {
                      lVar11 = *userPointer;
                      dVar21 = dVar21 + (double)*(float *)(lVar11 + lVar8 * 4);
LAB_001c483e:
                      fVar20 = (float)dVar21;
LAB_001c48b5:
                      *(float *)(lVar11 + lVar8 * 4) = fVar20;
                    }
                    else if (iVar5 == 0x1f) goto LAB_001c47dc;
                  }
                }
                else {
                  iVar5 = *(int *)((long)userPointer + 0x24);
                  if (*(int *)((long)userPointer + 0xd0) == 0) {
                    if (iVar5 < 0x1f) {
                      if (iVar5 == 0xb) {
                        cVar9 = (char)(int)*(double *)(lVar17 + lVar16 * 8);
                        goto LAB_001c48cd;
                      }
                      if (iVar5 == 0x15) {
                        sVar10 = (short)(int)*(double *)(lVar17 + lVar16 * 8);
                        goto LAB_001c4860;
                      }
                    }
                    else {
                      if (iVar5 == 0x52) {
                        dVar21 = *(double *)(lVar17 + lVar16 * 8);
                        goto LAB_001c48eb;
                      }
                      if (iVar5 == 0x2a) {
                        lVar11 = *userPointer;
                        dVar21 = (double)*(float *)(lVar11 + lVar8 * 4) +
                                 *(double *)(lVar17 + lVar16 * 8);
                        goto LAB_001c483e;
                      }
                      if (iVar5 == 0x1f) {
                        dVar21 = *(double *)(lVar17 + lVar16 * 8);
                        goto LAB_001c47dc;
                      }
                    }
                  }
                  else if (iVar5 < 0x1f) {
                    if (iVar5 == 0xb) {
                      dVar21 = 1.0 / *(double *)(lVar17 + lVar16 * 8);
                      goto LAB_001c48c9;
                    }
                    if (iVar5 == 0x15) {
                      dVar21 = 1.0 / *(double *)(lVar17 + lVar16 * 8);
                      goto LAB_001c485c;
                    }
                  }
                  else if (iVar5 == 0x52) {
                    dVar21 = 1.0 / *(double *)(lVar17 + lVar16 * 8);
LAB_001c48eb:
                    *(double *)(*userPointer + lVar8 * 8) =
                         dVar21 + *(double *)(*userPointer + lVar8 * 8);
                  }
                  else {
                    if (iVar5 == 0x2a) {
                      lVar11 = *userPointer;
                      fVar20 = (float)(1.0 / *(double *)(lVar17 + lVar16 * 8)) +
                               *(float *)(lVar11 + lVar8 * 4);
                      goto LAB_001c48b5;
                    }
                    if (iVar5 == 0x1f) {
                      dVar21 = 1.0 / *(double *)(lVar17 + lVar16 * 8);
LAB_001c47dc:
                      piVar1 = (int *)(*userPointer + lVar8 * 4);
                      *piVar1 = *piVar1 + (int)dVar21;
                    }
                  }
                }
              }
            }
LAB_001c4678:
            lVar16 = lVar16 + 1;
          } while (lVar16 < *(long *)((long)userPointer + 0xf8));
          lVar15 = lVar15 + lVar16;
        }
      }
      else {
        pcVar14 = pcVar18 + 1;
        if (*pcVar18 != '\0') goto LAB_001c463b;
        lVar15 = lVar15 + *(long *)((long)userPointer + 0xf8);
      }
      bVar19 = lVar12 != nrows;
      lVar12 = lVar12 + 1;
      pcVar18 = pcVar14;
    } while (bVar19);
  }
  *(char **)((long)userPointer + 0xf0) = pcVar14;
  return 0;
}

Assistant:

int ffcalchist(long totalrows, long offset, long firstrow, long nrows,
             int ncols, iteratorCol *colpars, void *userPointer)
/*
   Interator work function that calculates values for the 2D histogram.
*/
{
    long ii, ipix, iaxisbin;
    double pix, axisbin;
    char *rowselect;
    histType *histData = (histType*)userPointer;
    double *colptr[MAXDIMS] = {0};
    int status = 0;
    long irow;

    if (firstrow == 1) {
      histData->rowselector_cur = histData->rowselector;
    }
    rowselect = histData->rowselector_cur;

    for (ii=0; ii<=4; ii++) {
      int startCol = histData->startCols[ii];
      iteratorCol *outcol = 0;
      /* Call calculator work function.  Result is put in final column of colData as a TemporaryCol */
      colptr[ii] = 0;

      /* Do not process unspecified axes (but do process weight column) */
      if ( (ii >= histData->haxis && ii != 4) || histData->startCols[ii] < 0) continue;

      /* We have a parser for this, evaluate it */
      if (histData->parsers[ii].nCols > 0) {
	struct ParseStatusVariables *pv = &(histData->infos[ii].parseVariables);
	iteratorCol *colData = &(histData->iterCols[startCol]);
	int nCols = histData->parsers[ii].nCols;

	status = fits_parser_workfn(totalrows, offset, firstrow, nrows, 
				    nCols, colData, (void *) &(histData->infos[ii]));
	if (status) return status;
	/* Output column is last iterator column, which better be a TemporaryCol */
	outcol = &(colData[nCols-1]);

      } else {
	outcol = &(histData->iterCols[startCol]);
      }

      if (outcol) {
	/* Note that the 0th array element returned by the iterator is
	   actually the null value!  This is actually rather a big
	   undocumented "feature" of the iterator. However, "ii" below
	   starts at a value of 1 which skips over the null value */
	colptr[ii] = ((double *) fits_iter_get_array(outcol));
      }
    }

    /*  Main loop over rows */
    /* irow = row counter (1 .. nrows) */
    /* elem = counter of element (1 .. histData->repeat) for each row */
    /* ii = counts up from 1 (see note below) used to index colptr[]'s */

    /* Note that ii starts at 1 because position [0] in the 
       column data arrays is for the "null" value! */
    for (ii = 1, irow = 1; irow <= nrows; irow++) 
    {
        long elem;
        if (rowselect) {    /* if a row selector array is supplied... */

	  if (*rowselect) {
               rowselect++;   /* this row is included in the histogram */

	  } else {
               rowselect++;   /* this row is excluded from the histogram */

	       ii += histData->repeat; /* skip this portion of data */
               continue;
           }
        }


	/* Loop over elements in each row, increment ii after each element */

        for (elem = 1; elem <= histData->repeat; elem++, ii++) {
	  if (colptr[0][ii] == DOUBLENULLVALUE)  /* test for null value */
            continue;
	  if (colptr[4] && colptr[4][ii] == DOUBLENULLVALUE) /* and null weight */
	    continue;
	  
	  pix = (colptr[0][ii] - histData->amin1) / histData->binsize1;
	  ipix = (long) (pix + 1.); /* add 1 because the 1st pixel is the null value */
	  
	  /* test if bin is within range */
	  if (ipix < 1 || ipix > histData->haxis1 || pix > histData->maxbin1)
            continue;
	  
	  if (histData->haxis > 1)
	    {
	      if (colptr[1][ii] == DOUBLENULLVALUE)
		continue;
	      
	      axisbin = (colptr[1][ii] - histData->amin2) / histData->binsize2;
	      iaxisbin = (long) axisbin;
	      
	      if (axisbin < 0. || iaxisbin >= histData->haxis2 || axisbin > histData->maxbin2)
		continue;
	      
	      ipix += (iaxisbin * histData->incr[1]);
	      
	      if (histData->haxis > 2)
		{
		  if (colptr[2][ii] == DOUBLENULLVALUE)
		    continue;
		  
		  axisbin = (colptr[2][ii] - histData->amin3) / histData->binsize3;
		  iaxisbin = (long) axisbin;
		  if (axisbin < 0. || iaxisbin >= histData->haxis3 || axisbin > histData->maxbin3)
		    continue;
		  
		  ipix += (iaxisbin * histData->incr[2]);
		  
		  if (histData->haxis > 3)
		    {
		      if (colptr[3][ii] == DOUBLENULLVALUE)
			continue;
		      
		      axisbin = (colptr[3][ii] - histData->amin4) / histData->binsize4;
		      iaxisbin = (long) axisbin;
		      if (axisbin < 0. || iaxisbin >= histData->haxis4 || axisbin > histData->maxbin4)
			continue;
		      
		      ipix += (iaxisbin * histData->incr[3]);
		      
		    }  /* end of haxis > 3 case */
		}    /* end of haxis > 2 case */
	    }      /* end of haxis > 1 case */

	  /* increment the histogram pixel */
	  if (histData->weight != DOUBLENULLVALUE) /* constant weight factor */
	    {   /* Note that if wtrecip == 1, the reciprocal was precomputed above */
	      if (histData->himagetype == TINT)
		histData->hist.j[ipix] += (int) histData->weight;
	      else if (histData->himagetype == TSHORT)
		histData->hist.i[ipix] += (short) histData->weight;
	      else if (histData->himagetype == TFLOAT)
		histData->hist.r[ipix] += histData->weight;
	      else if (histData->himagetype == TDOUBLE)
		histData->hist.d[ipix] += histData->weight;
	      else if (histData->himagetype == TBYTE)
		histData->hist.b[ipix] += (char) histData->weight;
	    }
	  else if (histData->wtrecip) /* use reciprocal of the weight */
	    {
	      if (histData->himagetype == TINT)
		histData->hist.j[ipix] += (int) (1./colptr[4][ii]);
	      else if (histData->himagetype == TSHORT)
		histData->hist.i[ipix] += (short) (1./colptr[4][ii]);
	      else if (histData->himagetype == TFLOAT)
		histData->hist.r[ipix] += (float) (1./colptr[4][ii]);
	      else if (histData->himagetype == TDOUBLE)
		histData->hist.d[ipix] += 1./colptr[4][ii];
	      else if (histData->himagetype == TBYTE)
		histData->hist.b[ipix] += (char) (1./colptr[4][ii]);
	    }
	  else   /* no weights */
	    {
	      if (histData->himagetype == TINT)
		histData->hist.j[ipix] += (int) colptr[4][ii];
	      else if (histData->himagetype == TSHORT)
		histData->hist.i[ipix] += (short) colptr[4][ii];
	      else if (histData->himagetype == TFLOAT)
		histData->hist.r[ipix] += colptr[4][ii];
	      else if (histData->himagetype == TDOUBLE)
		histData->hist.d[ipix] += colptr[4][ii];
	      else if (histData->himagetype == TBYTE)
		histData->hist.b[ipix] += (char) colptr[4][ii];
	    }

	} /* end of loop over elements per row */

    }  /* end of main loop over all rows */

    histData->rowselector_cur = rowselect; /* Save row pointer for next go-round */
    return(status);
}